

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_facelift.c
# Opt level: O3

REF_STATUS ref_facelift_complexity(REF_DBL *metric,REF_GRID ref_grid,REF_DBL *complexity)

{
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_STATUS RVar1;
  int iVar2;
  uint uVar3;
  undefined8 uVar4;
  long lVar5;
  int cell;
  char *pcVar6;
  double dVar7;
  REF_DBL det;
  REF_DBL area;
  REF_DBL s [3];
  REF_DBL r [3];
  REF_DBL n [3];
  REF_DBL m2 [3];
  REF_INT nodes [27];
  double local_138;
  double local_130;
  REF_DBL local_128 [4];
  REF_DBL local_108 [4];
  REF_DBL local_e8 [4];
  REF_DBL local_c8 [4];
  REF_INT local_a8 [30];
  
  ref_node = ref_grid->node;
  ref_cell = ref_grid->cell[3];
  *complexity = 0.0;
  if (0 < ref_cell->max) {
    cell = 0;
    do {
      RVar1 = ref_cell_nodes(ref_cell,cell,local_a8);
      if (RVar1 == 0) {
        uVar3 = ref_node_tri_area(ref_node,local_a8,&local_130);
        if (uVar3 != 0) {
          pcVar6 = "area";
          uVar4 = 0x536;
          goto LAB_001b03ab;
        }
        iVar2 = ref_cell->node_per;
        if (0 < iVar2) {
          lVar5 = 0;
          do {
            if (ref_node->ref_mpi->id == ref_node->part[local_a8[lVar5]]) {
              uVar3 = ref_recon_rsn(ref_grid,local_a8[lVar5],local_108,local_128,local_e8);
              if (uVar3 != 0) {
                pcVar6 = "rsn";
                uVar4 = 0x539;
                goto LAB_001b03ab;
              }
              uVar3 = ref_matrix_extract2(metric + (long)local_a8[lVar5] * 6,local_108,local_128,
                                          local_c8);
              if (uVar3 != 0) {
                pcVar6 = "extract";
                uVar4 = 0x53b;
                goto LAB_001b03ab;
              }
              uVar3 = ref_matrix_det_m2(local_c8,&local_138);
              if (uVar3 != 0) {
                pcVar6 = "2x2 det";
                uVar4 = 0x53c;
                goto LAB_001b03ab;
              }
              if (local_138 <= 0.0) {
                iVar2 = ref_cell->node_per;
              }
              else {
                if (local_138 < 0.0) {
                  dVar7 = sqrt(local_138);
                }
                else {
                  dVar7 = SQRT(local_138);
                }
                iVar2 = ref_cell->node_per;
                *complexity = (dVar7 * local_130) / (double)iVar2 + *complexity;
              }
            }
            lVar5 = lVar5 + 1;
          } while (lVar5 < iVar2);
        }
      }
      cell = cell + 1;
    } while (cell < ref_cell->max);
  }
  uVar3 = ref_mpi_allsum(ref_grid->mpi,complexity,1,3);
  if (uVar3 == 0) {
    uVar3 = 0;
  }
  else {
    pcVar6 = "dbl sum";
    uVar4 = 0x545;
LAB_001b03ab:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
           uVar4,"ref_facelift_complexity",(ulong)uVar3,pcVar6);
  }
  return uVar3;
}

Assistant:

REF_FCN static REF_STATUS ref_facelift_complexity(REF_DBL *metric,
                                                  REF_GRID ref_grid,
                                                  REF_DBL *complexity) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT cell_node, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL area, det, m2[3], r[3], s[3], n[3];
  ref_cell = ref_grid_tri(ref_grid);
  *complexity = 0.0;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(ref_node_tri_area(ref_node, nodes, &area), "area");
    for (cell_node = 0; cell_node < ref_cell_node_per(ref_cell); cell_node++) {
      if (ref_node_owned(ref_node, nodes[cell_node])) {
        RSS(ref_recon_rsn(ref_grid, nodes[cell_node], r, s, n), "rsn");
        RSS(ref_matrix_extract2(&(metric[6 * nodes[cell_node]]), r, s, m2),
            "extract");
        RSS(ref_matrix_det_m2(m2, &det), "2x2 det");
        if (det > 0.0) {
          (*complexity) +=
              sqrt(det) * area / ((REF_DBL)ref_cell_node_per(ref_cell));
        }
      }
    }
  }
  RSS(ref_mpi_allsum(ref_grid_mpi(ref_grid), complexity, 1, REF_DBL_TYPE),
      "dbl sum");

  return REF_SUCCESS;
}